

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator2DnonUniform::
IfcCartesianTransformationOperator2DnonUniform(IfcCartesianTransformationOperator2DnonUniform *this)

{
  IfcCartesianTransformationOperator2DnonUniform *this_local;
  
  STEP::Object::Object
            ((Object *)
             &(this->
              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator2DnonUniform,_1UL>
              ).field_0x20,"IfcCartesianTransformationOperator2DnonUniform");
  IfcCartesianTransformationOperator2D::IfcCartesianTransformationOperator2D
            ((IfcCartesianTransformationOperator2D *)this,&PTR_construction_vtable_24__00e44270);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator2DnonUniform,_1UL>::
  ObjectHelper(&this->
                super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator2DnonUniform,_1UL>
               ,&PTR_construction_vtable_24__00e44320);
  *(undefined8 *)this = 0xe44190;
  *(undefined8 *)
   &(this->
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator2DnonUniform,_1UL>
    ).field_0x20 = 0xe44258;
  *(undefined8 *)&this->field_0x10 = 0xe441b8;
  *(undefined8 *)&this->field_0x20 = 0xe441e0;
  *(undefined8 *)&this->field_0x68 = 0xe44208;
  (this->
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator2DnonUniform,_1UL>).
  _vptr_ObjectHelper = (_func_int **)0xe44230;
  STEP::Maybe<double>::Maybe
            ((Maybe<double> *)
             &(this->
              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator2DnonUniform,_1UL>
              ).field_0x10);
  return;
}

Assistant:

IfcCartesianTransformationOperator2DnonUniform() : Object("IfcCartesianTransformationOperator2DnonUniform") {}